

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Extract.hpp
# Opt level: O3

extraction_result_t * __thiscall
bredis::extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::operator()
          (extraction_result_t *__return_storage_ptr__,
          extractor<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *this,
          int_t<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *value)

{
  bool bVar1;
  string str;
  type local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  bad_lexical_cast local_30;
  
  local_48 = 0;
  local_40[0] = '\0';
  local_50 = local_40;
  std::__cxx11::string::reserve((ulong)&local_50);
  std::__cxx11::string::
  _M_replace_dispatch<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
            ((string *)&local_50,local_50 + local_48);
  local_58 = (type)0x0;
  local_30.source = (type_info_t *)(local_50 + local_48);
  local_30._0_8_ = local_50;
  bVar1 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_signed<long>((lexical_ostream_limited_src<char,_std::char_traits<char>_> *)&local_30,
                           (long *)&local_58);
  if (bVar1) {
    (__return_storage_ptr__->storage_).super_aligned_storage_imp<32UL,_8UL>.data_.align_ = local_58;
    __return_storage_ptr__->which_ = 0;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    return __return_storage_ptr__;
  }
  local_30._0_8_ = &PTR__bad_cast_001f4c00;
  local_30.source = (type_info_t *)&std::__cxx11::string::typeinfo;
  local_30.target = (type_info_t *)&long::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>(&local_30);
}

Assistant:

extracts::extraction_result_t
    operator()(const markers::int_t<Iterator> &value) const {
        std::string str;
        auto size = std::distance(value.string.from, value.string.to);
        str.reserve(size);
        str.append(value.string.from, value.string.to);
        return extracts::int_t{boost::lexical_cast<extracts::int_t>(str)};
    }